

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 FastJsonEncode(jx9_value *pValue,SyBlob *pOut,int iNest)

{
  undefined8 *puVar1;
  jx9_hashmap_node *pjVar2;
  ulong uVar3;
  uint uVar4;
  sxi32 sVar5;
  jx9_value *pjVar6;
  ushort uVar7;
  sxu32 nSize;
  int c;
  jx9_value sKey;
  
  if (pValue == (jx9_value *)0x0) {
    uVar4 = 0x20;
  }
  else {
    uVar4 = pValue->iFlags;
  }
  if (0x3f < iNest) {
    return -7;
  }
  if ((uVar4 & 0x120) == 0) {
    if ((uVar4 & 8) == 0) {
      if ((uVar4 & 1) != 0) {
        c = 8;
        uVar4 = (pValue->sBlob).nByte;
        sKey.x.iVal._0_4_ =
             uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
        sVar5 = SyBlobAppend(pOut,&c,1);
        if (sVar5 != 0) {
          return sVar5;
        }
        sVar5 = SyBlobAppend(pOut,&sKey,4);
        if (sVar5 != 0) {
          return sVar5;
        }
        pjVar6 = (jx9_value *)(pValue->sBlob).pBlob;
        nSize = (pValue->sBlob).nByte;
        goto LAB_00117cab;
      }
      if ((uVar4 & 2) != 0) {
        c = 10;
        sVar5 = SyBlobAppend(pOut,&c,1);
        if (sVar5 != 0) {
          return sVar5;
        }
        uVar3 = (pValue->x).iVal;
        sKey.x.iVal = uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 |
                      (uVar3 & 0xff0000000000) >> 0x18 | (uVar3 & 0xff00000000) >> 8 |
                      (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
                      (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
        pjVar6 = &sKey;
        nSize = 8;
        goto LAB_00117cab;
      }
      if ((uVar4 & 4) != 0) {
        c = 0x12;
        sVar5 = SyBlobAppend(pOut,&c,1);
        if (sVar5 != 0) {
          return sVar5;
        }
        uVar4 = pOut->nByte;
        sVar5 = SyBlobAppendBig16(pOut,0);
        if (sVar5 != 0) {
          return sVar5;
        }
        SyBlobFormat(pOut,"%.15g",(pValue->x).rVal);
        uVar7 = ((short)pOut->nByte - (short)uVar4) - 2;
        *(ushort *)((long)pOut->pBlob + (ulong)uVar4) = uVar7 * 0x100 | uVar7 >> 8;
        return 0;
      }
      if ((uVar4 & 0x40) == 0) {
        return 0;
      }
      puVar1 = (undefined8 *)(pValue->x).pOther;
      puVar1[4] = puVar1[2];
      if ((*(byte *)(puVar1 + 8) & 1) == 0) {
        c = 3;
        sVar5 = SyBlobAppend(pOut,&c,1);
        if (sVar5 != 0) {
          return sVar5;
        }
        while (pjVar2 = (jx9_hashmap_node *)puVar1[4], pjVar2 != (jx9_hashmap_node *)0x0) {
          puVar1[4] = pjVar2->pPrev;
          pjVar6 = HashmapExtractNodeValue(pjVar2);
          sVar5 = FastJsonEncode(pjVar6,pOut,iNest + 1);
          if (sVar5 != 0) {
            return sVar5;
          }
          c = 6;
          sVar5 = SyBlobAppend(pOut,&c,1);
          if (sVar5 != 0) {
            return sVar5;
          }
        }
        c = 4;
      }
      else {
        c = 1;
        sVar5 = SyBlobAppend(pOut,&c,1);
        if (sVar5 != 0) {
          return sVar5;
        }
        jx9MemObjInit((jx9_vm *)*puVar1,&sKey);
        do {
          pjVar2 = (jx9_hashmap_node *)puVar1[4];
          if (pjVar2 == (jx9_hashmap_node *)0x0) {
            sVar5 = 0;
            break;
          }
          puVar1[4] = pjVar2->pPrev;
          jx9HashmapExtractNodeKey(pjVar2,&sKey);
          sVar5 = FastJsonEncode(&sKey,pOut,iNest + 1);
          if (sVar5 != 0) break;
          c = 5;
          sVar5 = SyBlobAppend(pOut,&c,1);
          if (sVar5 != 0) break;
          pjVar6 = HashmapExtractNodeValue(pjVar2);
          sVar5 = FastJsonEncode(pjVar6,pOut,iNest + 1);
          if (sVar5 != 0) break;
          c = 6;
          sVar5 = SyBlobAppend(pOut,&c,1);
        } while (sVar5 == 0);
        jx9MemObjRelease(&sKey);
        if (sVar5 != 0) {
          return sVar5;
        }
        c = 2;
      }
    }
    else {
      c = ((pValue->x).iVal == 0) + 0x18;
    }
  }
  else {
    c = 0x17;
  }
  pjVar6 = (jx9_value *)&c;
  nSize = 1;
LAB_00117cab:
  sVar5 = SyBlobAppend(pOut,pjVar6,nSize);
  return sVar5;
}

Assistant:

UNQLITE_PRIVATE sxi32 FastJsonEncode(
	jx9_value *pValue, /* Value to encode */
	SyBlob *pOut,      /* Store encoded value here */
	int iNest          /* Nesting limit */ 
	)
{
	sxi32 iType = pValue ? pValue->iFlags : MEMOBJ_NULL;
	sxi32 rc = SXRET_OK;
	int c;
	if( iNest >= UNQLITE_FAST_JSON_NEST_LIMIT ){
		/* Nesting limit reached */
		return SXERR_LIMIT;
	}
	if( iType & (MEMOBJ_NULL|MEMOBJ_RES) ){
		/*
		 * Resources are encoded as null also.
		 */
		c = FJSON_NULL;
		rc = SyBlobAppend(pOut,(const void *)&c,sizeof(char));
	}else if( iType & MEMOBJ_BOOL ){
		c = pValue->x.iVal ? FJSON_TRUE : FJSON_FALSE;
		rc = SyBlobAppend(pOut,(const void *)&c,sizeof(char));
	}else if( iType & MEMOBJ_STRING ){
		unsigned char zBuf[sizeof(sxu32)]; /* String length */
		c = FJSON_STRING;
		SyBigEndianPack32(zBuf,SyBlobLength(&pValue->sBlob));
		rc = SyBlobAppend(pOut,(const void *)&c,sizeof(char));
		if( rc == SXRET_OK ){
			rc = SyBlobAppend(pOut,(const void *)zBuf,sizeof(zBuf));
			if( rc == SXRET_OK ){
				rc = SyBlobAppend(pOut,SyBlobData(&pValue->sBlob),SyBlobLength(&pValue->sBlob));
			}
		}
	}else if( iType & MEMOBJ_INT ){
		unsigned char zBuf[8];
		/* 64bit big endian integer */
		c = FJSON_INT64;
		rc = SyBlobAppend(pOut,(const void *)&c,sizeof(char));
		if( rc == SXRET_OK ){
			SyBigEndianPack64(zBuf,(sxu64)pValue->x.iVal);
			rc = SyBlobAppend(pOut,(const void *)zBuf,sizeof(zBuf));
		}
	}else if( iType & MEMOBJ_REAL ){
		/* Real number */
		c = FJSON_REAL;
		rc = SyBlobAppend(pOut,(const void *)&c,sizeof(char));
		if( rc == SXRET_OK ){
			sxu32 iOfft = SyBlobLength(pOut);
			rc = SyBlobAppendBig16(pOut,0);
			if( rc == SXRET_OK ){
				unsigned char *zBlob;
				SyBlobFormat(pOut,"%.15g",pValue->x.rVal);
				zBlob = (unsigned char *)SyBlobDataAt(pOut,iOfft);
				SyBigEndianPack16(zBlob,(sxu16)(SyBlobLength(pOut) - ( 2 + iOfft)));
			}
		}
	}else if( iType & MEMOBJ_HASHMAP ){
		/* A JSON object or array */
		jx9_hashmap *pMap = (jx9_hashmap *)pValue->x.pOther;
		jx9_hashmap_node *pNode;
		jx9_value *pEntry;
		/* Reset the hashmap loop cursor */
		jx9HashmapResetLoopCursor(pMap);
		if( pMap->iFlags & HASHMAP_JSON_OBJECT ){
			jx9_value sKey;
			/* A JSON object */
			c = FJSON_DOC_START; /* { */
			rc = SyBlobAppend(pOut,(const void *)&c,sizeof(char));
			if( rc == SXRET_OK ){
				jx9MemObjInit(pMap->pVm,&sKey);
				/* Encode object entries */
				while((pNode = jx9HashmapGetNextEntry(pMap)) != 0 ){
					/* Extract the key */
					jx9HashmapExtractNodeKey(pNode,&sKey);
					/* Encode it */
					rc = FastJsonEncode(&sKey,pOut,iNest+1);
					if( rc != SXRET_OK ){
						break;
					}
					c = FJSON_COLON;
					rc = SyBlobAppend(pOut,(const void *)&c,sizeof(char));
					if( rc != SXRET_OK ){
						break;
					}
					/* Extract the value */
					pEntry = jx9HashmapGetNodeValue(pNode);
					/* Encode it */
					rc = FastJsonEncode(pEntry,pOut,iNest+1);
					if( rc != SXRET_OK ){
						break;
					}
					/* Delimit the entry */
					c = FJSON_COMMA;
					rc = SyBlobAppend(pOut,(const void *)&c,sizeof(char));
					if( rc != SXRET_OK ){
						break;
					}
				}
				jx9MemObjRelease(&sKey);
				if( rc == SXRET_OK ){
					c = FJSON_DOC_END; /* } */
					rc = SyBlobAppend(pOut,(const void *)&c,sizeof(char));
				}
			}
		}else{
			/* A JSON array */
			c = FJSON_ARRAY_START; /* [ */
			rc = SyBlobAppend(pOut,(const void *)&c,sizeof(char));
			if( rc == SXRET_OK ){
				/* Encode array entries */
				while( (pNode = jx9HashmapGetNextEntry(pMap)) != 0 ){
					/* Extract the value */
					pEntry = jx9HashmapGetNodeValue(pNode);
					/* Encode it */
					rc = FastJsonEncode(pEntry,pOut,iNest+1);
					if( rc != SXRET_OK ){
						break;
					}
					/* Delimit the entry */
					c = FJSON_COMMA;
					rc = SyBlobAppend(pOut,(const void *)&c,sizeof(char));
					if( rc != SXRET_OK ){
						break;
					}
				}
				if( rc == SXRET_OK ){
					c = FJSON_ARRAY_END; /* ] */
					rc = SyBlobAppend(pOut,(const void *)&c,sizeof(char));
				}
			}
		}
	}
	return rc;
}